

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_utimes(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  char *__file;
  int *piVar3;
  JSValueUnion JVar4;
  int64_t iVar5;
  JSValue JVar6;
  int64_t mtime;
  int64_t atime;
  timeval times [2];
  ulong local_58;
  ulong local_50;
  timeval local_48;
  ulong local_38;
  long local_30;
  
  iVar1 = JS_ToInt64(ctx,(int64_t *)&local_50,argv[1]);
  iVar5 = 6;
  if (iVar1 == 0) {
    iVar1 = JS_ToInt64(ctx,(int64_t *)&local_58,argv[2]);
    if (iVar1 == 0) {
      JVar4.float64 = 0.0;
      __file = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
      if (__file != (char *)0x0) {
        local_48.tv_sec = local_50 / 1000;
        local_48.tv_usec = (local_50 % 1000) * 1000;
        local_38 = local_58 / 1000;
        local_30 = (local_58 % 1000) * 1000;
        uVar2 = utimes(__file,&local_48);
        if (uVar2 == 0xffffffff) {
          piVar3 = __errno_location();
          uVar2 = -*piVar3;
        }
        JS_FreeCString(ctx,__file);
        JVar4._4_4_ = 0;
        JVar4.int32 = uVar2;
        iVar5 = 0;
      }
      goto LAB_001137e9;
    }
  }
  JVar4.float64 = 0.0;
LAB_001137e9:
  JVar6.tag = iVar5;
  JVar6.u.float64 = JVar4.float64;
  return JVar6;
}

Assistant:

static JSValue js_os_utimes(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    const char *path;
    int64_t atime, mtime;
    int ret;
    
    if (JS_ToInt64(ctx, &atime, argv[1]))
        return JS_EXCEPTION;
    if (JS_ToInt64(ctx, &mtime, argv[2]))
        return JS_EXCEPTION;
    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
#if defined(_WIN32)
    {
        struct _utimbuf times;
        times.actime = atime / 1000;
        times.modtime = mtime / 1000;
        ret = js_get_errno(_utime(path, &times));
    }
#else
    {
        struct timeval times[2];
        ms_to_timeval(&times[0], atime);
        ms_to_timeval(&times[1], mtime);
        ret = js_get_errno(utimes(path, times));
    }
#endif
    JS_FreeCString(ctx, path);
    return JS_NewInt32(ctx, ret);
}